

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberOverlappingOffsetsTest::gcd
          (UniformBlockMemberOverlappingOffsetsTest *this,GLuint a,GLuint b)

{
  uint uVar1;
  uint *puVar2;
  GLuint lesser;
  GLuint greater;
  GLuint b_local;
  GLuint a_local;
  UniformBlockMemberOverlappingOffsetsTest *this_local;
  
  if ((a == 0) || (this_local._4_4_ = a, b != 0)) {
    lesser = b;
    greater = a;
    _b_local = this;
    puVar2 = std::max<unsigned_int>(&greater,&lesser);
    uVar1 = *puVar2;
    puVar2 = std::min<unsigned_int>(&greater,&lesser);
    this_local._4_4_ = gcd(this,*puVar2,uVar1 % *puVar2);
  }
  return this_local._4_4_;
}

Assistant:

GLuint UniformBlockMemberOverlappingOffsetsTest::gcd(GLuint a, GLuint b)
{
	if ((0 != a) && (0 == b))
	{
		return a;
	}
	else
	{
		GLuint greater = std::max(a, b);
		GLuint lesser  = std::min(a, b);

		return gcd(lesser, greater % lesser);
	}
}